

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  int iVar1;
  int iVar2;
  Expr *p;
  
  p = sqlite3ExprSkipCollate(pExpr);
  if ((pParse->okConstFactor != '\0') && (p->op != 0x9d)) {
    iVar1 = sqlite3ExprIsConstantNotJoin(p);
    if (iVar1 != 0) {
      *pReg = 0;
      iVar1 = sqlite3ExprCodeAtInit(pParse,p,-1);
      return iVar1;
    }
  }
  iVar1 = sqlite3GetTempReg(pParse);
  iVar2 = sqlite3ExprCodeTarget(pParse,p,iVar1);
  if (iVar2 != iVar1) {
    sqlite3ReleaseTempReg(pParse,iVar1);
    iVar1 = 0;
  }
  *pReg = iVar1;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( ConstFactorOk(pParse)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeAtInit(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}